

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  uint uVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Bool BVar4;
  int iVar5;
  Node *pNVar6;
  ulong uVar7;
  ulong uVar8;
  Node *pNVar9;
  Node *pNVar10;
  char *property;
  Node *unaff_R12;
  bool bVar11;
  bool bVar12;
  TidyParserMemory memory;
  
  if ((list == (Node *)0x0) || (list->tag == (Dict *)0x0)) {
    bVar12 = false;
  }
  else {
    bVar12 = list->tag->id == TidyTag_OL;
  }
  pLVar2 = doc->lexer;
  if (list == (Node *)0x0) {
    iVar5 = (doc->stack).top;
    if ((long)iVar5 < 0) {
      list = (Node *)0x0;
    }
    else {
      list = (doc->stack).content[iVar5].original_node;
      (doc->stack).top = iVar5 + -1;
    }
  }
  else if ((list->tag->model & 1) != 0) {
    return (Node *)0x0;
  }
  pLVar2->insert = (IStack *)0x0;
  do {
    pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
    if (pNVar6 == (Node *)0x0) {
      prvTidyReport(doc,list,(Node *)0x0,0x25a);
      return (Node *)0x0;
    }
    if ((pNVar6->tag == list->tag) && (pNVar6->type == EndTag)) {
      prvTidyFreeNode(doc,pNVar6);
      list->closed = yes;
      goto LAB_0013b40a;
    }
    BVar4 = InsertMisc(list,pNVar6);
    iVar5 = 2;
    if (BVar4 == no) {
      if ((pNVar6->type == TextNode) || (pNVar6->tag != (Dict *)0x0)) {
        if (pLVar2 != (Lexer *)0x0 && pNVar6->type == TextNode) {
          uVar1 = pNVar6->end;
          bVar11 = pNVar6->start < uVar1;
          if (bVar11) {
            uVar8 = (ulong)pNVar6->start;
            do {
              uVar7 = uVar8 + 1;
              if ((0x20 < (ulong)(byte)pLVar2->lexbuf[uVar8]) ||
                 ((0x100002600U >> ((ulong)(byte)pLVar2->lexbuf[uVar8] & 0x3f) & 1) == 0)) {
                iVar5 = 0;
                if (bVar11) goto LAB_0013b4be;
                break;
              }
              bVar11 = uVar7 < uVar1;
              uVar8 = uVar7;
            } while (uVar7 != uVar1);
          }
          prvTidyFreeNode(doc,pNVar6);
          iVar5 = 2;
LAB_0013b4be:
          if (!bVar11) goto LAB_0013b7f8;
        }
        pDVar3 = pNVar6->tag;
        if (pNVar6->type != EndTag) {
          if (pDVar3 == (Dict *)0x0) {
            if (bVar12) goto LAB_0013b5b2;
LAB_0013b5e5:
            bVar11 = false;
          }
          else {
            if (!(bool)(bVar12 & pDVar3->id != TidyTag_LI)) goto LAB_0013b5e5;
LAB_0013b5b2:
            pNVar9 = list->content;
            if (pNVar9 == (Node *)0x0) goto LAB_0013b5e5;
            pNVar10 = (Node *)0x0;
            do {
              if (((pNVar9->tag != (Dict *)0x0) && (pNVar9->tag->id == TidyTag_LI)) &&
                 (pNVar9->type == StartTag)) {
                pNVar10 = pNVar9;
              }
              pNVar9 = pNVar9->next;
            } while (pNVar9 != (Node *)0x0);
            bVar11 = pNVar10 != (Node *)0x0;
          }
          unaff_R12 = pNVar6;
          if (((pDVar3 == (Dict *)0x0) || (pDVar3->id != TidyTag_LI)) &&
             (BVar4 = prvTidyIsHTML5Mode(doc), BVar4 == no || bVar11)) {
            prvTidyUngetToken(doc);
            BVar4 = prvTidynodeHasCM(pNVar6,8);
            if ((BVar4 == no) || (pLVar2->excludeBlocks == no)) {
              if ((pLVar2->exiled == no) ||
                 ((BVar4 = prvTidynodeHasCM(pNVar6,0x380), BVar4 == no &&
                  ((pNVar6->tag == (Dict *)0x0 || (pNVar6->tag->id != TidyTag_TABLE)))))) {
                if ((list == (Node *)0x0) ||
                   ((list->tag == (Dict *)0x0 || (list->tag->id != TidyTag_OL)))) {
LAB_0013b710:
                  BVar4 = prvTidynodeHasCM(pNVar6,8);
                  unaff_R12 = prvTidyInferredTag(doc,TidyTag_LI);
                  property = "list-style: none; display: inline";
                  if (BVar4 == no) {
                    property = "list-style: none";
                  }
                  prvTidyAddStyleProperty(doc,unaff_R12,property);
                  prvTidyReport(doc,list,unaff_R12,0x261);
                  goto LAB_0013b765;
                }
                unaff_R12 = (Node *)0x0;
                for (pNVar9 = list->content; pNVar9 != (Node *)0x0; pNVar9 = pNVar9->next) {
                  if (((pNVar9->tag != (Dict *)0x0) && (pNVar9->tag->id == TidyTag_LI)) &&
                     (pNVar9->type == StartTag)) {
                    unaff_R12 = pNVar9;
                  }
                }
                if (unaff_R12 == (Node *)0x0) goto LAB_0013b710;
                pNVar6 = prvTidyInferredTag(doc,TidyTag_LI);
                prvTidyReport(doc,list,pNVar6,0x261);
                prvTidyFreeNode(doc,pNVar6);
                goto LAB_0013b79a;
              }
            }
            else {
              prvTidyReport(doc,list,pNVar6,0x259);
            }
LAB_0013b40a:
            unaff_R12 = (Node *)0x0;
            iVar5 = 1;
            goto LAB_0013b7f8;
          }
LAB_0013b765:
          unaff_R12->parent = list;
          if (list == (Node *)0x0) {
            unaff_R12->prev = (Node *)0x0;
LAB_0013b78d:
            if (list != (Node *)0x0) {
              list->content = unaff_R12;
              goto LAB_0013b796;
            }
          }
          else {
            pNVar6 = list->last;
            unaff_R12->prev = pNVar6;
            if (pNVar6 == (Node *)0x0) goto LAB_0013b78d;
            pNVar6->next = unaff_R12;
            if (list == (Node *)0x0) goto LAB_0013b79a;
LAB_0013b796:
            list->last = unaff_R12;
          }
LAB_0013b79a:
          prvTidypushMemory(doc,(TidyParserMemory)
                                ZEXT2448(CONCAT816(unaff_R12,CONCAT88(list,prvTidyParseList))));
          iVar5 = 1;
          goto LAB_0013b7f8;
        }
        if ((pDVar3 != (Dict *)0x0) && (pDVar3->id == TidyTag_FORM)) {
          *(byte *)&doc->badForm = (byte)doc->badForm | 1;
          goto LAB_0013b4e4;
        }
        BVar4 = prvTidynodeHasCM(pNVar6,0x10);
        pNVar9 = list;
        if (BVar4 == no) {
          do {
            pNVar9 = pNVar9->parent;
            if ((pNVar9 == (Node *)0x0) ||
               ((pDVar3 = pNVar9->tag, pDVar3 != (Dict *)0x0 && (pDVar3->id == TidyTag_BODY))))
            goto LAB_0013b4e4;
          } while (pNVar6->tag != pDVar3);
          prvTidyReport(doc,list,pNVar6,0x259);
          prvTidyUngetToken(doc);
          goto LAB_0013b40a;
        }
        prvTidyReport(doc,list,pNVar6,0x235);
        prvTidyPopInline(doc,pNVar6);
      }
      else {
LAB_0013b4e4:
        prvTidyReport(doc,list,pNVar6,0x235);
      }
      prvTidyFreeNode(doc,pNVar6);
      iVar5 = 2;
    }
LAB_0013b7f8:
    if (iVar5 != 2) {
      return unaff_R12;
    }
  } while( true );
}

Assistant:

Node* TY_(ParseList)( TidyDocImpl* doc, Node *list, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    Node *lastli = NULL;;
    Bool wasblock = no;
    Bool nodeisOL = nodeIsOL(list);
    DEBUG_LOG_COUNTERS;

    if ( list == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        list = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(list);

        if (list->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }
    
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        Bool foundLI = no;
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (node->type != TextNode && node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        if (lexer && (node->type == TextNode))
        {
            uint ch, ix = node->start;
            /* Issue #572 - Skip whitespace. */
            while (ix < node->end && (ch = (lexer->lexbuf[ix] & 0xff))
                && (ch == ' ' || ch == '\t' || ch == '\r' || ch == '\n'))
                ++ix;
            if (ix >= node->end)
            {
                /* Issue #572 - Discard if ALL whitespace. */
                TY_(FreeNode)(doc, node);
                continue;
            }
        }


        /*
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            if (TY_(nodeHasCM)(node,CM_INLINE))
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(PopInline)( doc, node );
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = list->parent;
                  parent != NULL; parent = parent->parent )
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1053626. */
                if (nodeIsBODY(parent))
                    break;
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }

            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsLI(node) && nodeisOL )
        {
            /* Issue #572 - A <ol><li> can have nested <ol> elements */
            foundLI = FindLastLI(list, &lastli); /* find last <li> */
        }

        if ( nodeIsLI(node) || (TY_(IsHTML5Mode)(doc) && !foundLI) )
        {
            /* node is <LI> OR
               Issue #396 - A <ul> can have Zero or more <li> elements
             */
            TY_(InsertNodeAtEnd)(list,node);
        }
        else
        {
            TY_(UngetToken)( doc );

            if (TY_(nodeHasCM)(node,CM_BLOCK) && lexer->excludeBlocks)
            {
                TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                DEBUG_LOG_EXIT;
                return NULL;
            }
            /* http://tidy.sf.net/issue/1316307 */
            /* In exiled mode, return so table processing can continue. */
            else if ( lexer->exiled
                      && (TY_(nodeHasCM)(node, CM_TABLE|CM_ROWGRP|CM_ROW)
                          || nodeIsTABLE(node)) )
            {
                DEBUG_LOG_EXIT;
                return NULL;
            }
            /* http://tidy.sf.net/issue/836462
               If "list" is an unordered list, insert the next tag within
               the last <li> to preserve the numbering to match the visual
               rendering of most browsers. */
            if ( nodeIsOL(list) && FindLastLI(list, &lastli) )
            {
                /* Create a node for error reporting */
                node = TY_(InferredTag)(doc, TidyTag_LI);
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(FreeNode)( doc, node);
                node = lastli;
            }
            else
            {
                /* Add an inferred <li> */
                wasblock = TY_(nodeHasCM)(node,CM_BLOCK);
                node = TY_(InferredTag)(doc, TidyTag_LI);
                /* Add "display: inline" to avoid a blank line after <li> with
                   Internet Explorer. See http://tidy.sf.net/issue/836462 */
                TY_(AddStyleProperty)( doc, node,
                                       wasblock
                                       ? "list-style: none; display: inline"
                                       : "list-style: none"
                                       );
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(InsertNodeAtEnd)(list,node);
            }
        }

        {
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseList);
            memory.original_node = list;
            memory.reentry_node = node;
            memory.mode = IgnoreWhitespace;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}